

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.h
# Opt level: O2

int __thiscall
kj::File::clone(File *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Own<const_kj::File,_std::nullptr_t> *result;
  Own<const_kj::FsNode,_std::nullptr_t> local_20;
  
  (**(code **)(*(long *)__fn + 0x28))(&local_20);
  (this->super_ReadableFile).super_FsNode._vptr_FsNode = (_func_int **)0x0;
  this[1].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)0x0;
  if (local_20.ptr != (FsNode *)0x0) {
    this[1].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)local_20.ptr;
    (this->super_ReadableFile).super_FsNode._vptr_FsNode = (_func_int **)local_20.disposer;
    local_20.ptr = (FsNode *)0x0;
  }
  Own<const_kj::FsNode,_std::nullptr_t>::dispose(&local_20);
  return (int)this;
}

Assistant:

inline Own<const File> File::clone() const { return cloneFsNode().downcast<const File>(); }